

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

void __thiscall cfd::core::Block::Block(Block *this,Block *object)

{
  BlockHeader *this_00;
  Block *object_local;
  Block *this_local;
  
  this->_vptr_Block = (_func_int **)&PTR__Block_00b677b0;
  this_00 = (BlockHeader *)&this->data_;
  ByteData::ByteData((ByteData *)this_00);
  BlockHeader::BlockHeader(this_00);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&this->txs_);
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::vector(&this->txids_);
  ByteData::operator=(&this->data_,&object->data_);
  BlockHeader::operator=(&this->header_,&object->header_);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&this->txs_,&object->txs_);
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::operator=
            (&this->txids_,&object->txids_);
  return;
}

Assistant:

Block::Block(const Block& object) {
  data_ = object.data_;
  header_ = object.header_;
  txs_ = object.txs_;
  txids_ = object.txids_;
}